

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::decode_next_row(jpeg_decoder *this)

{
  huff_tables *pH;
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int *piVar7;
  int iVar8;
  long lVar9;
  short *psVar10;
  int r;
  int extra_bits;
  ulong local_48;
  short *local_40;
  long local_38;
  
  local_48 = 0;
  do {
    if (this->m_mcus_per_row <= (int)local_48) {
      return;
    }
    if ((this->m_restart_interval != 0) && (this->m_restarts_left == 0)) {
      process_restart(this);
    }
    psVar10 = this->m_pMCU_coefficients;
    lVar9 = 0;
    while (lVar9 < this->m_blocks_per_mcu) {
      iVar3 = this->m_mcu_org[lVar9];
      local_40 = this->m_quant[this->m_comp_quant[iVar3]];
      uVar1 = huff_decode(this,this->m_pHuff_tabs[this->m_comp_dc_tab[iVar3]],&r);
      iVar4 = r;
      if (r < *(int *)(s_extend_test + (ulong)(uVar1 & 0xf) * 4)) {
        iVar4 = r + *(int *)(s_extend_offset + (ulong)(uVar1 & 0xf) * 4);
      }
      uVar5 = iVar4 + this->m_last_dc_val[iVar3];
      this->m_last_dc_val[iVar3] = uVar5;
      *psVar10 = (short)uVar5 * *local_40;
      iVar4 = this->m_mcu_block_max_zag[lVar9];
      pH = this->m_pHuff_tabs[this->m_comp_ac_tab[iVar3]];
      iVar3 = 1;
      local_38 = lVar9;
      while (iVar3 < 0x40) {
        uVar1 = huff_decode(this,pH,&extra_bits);
        r = (int)uVar1 >> 4;
        uVar6 = uVar1 & 0xf;
        if (uVar6 == 0) {
          if (r != 0xf) break;
          if (0x30 < iVar3) {
LAB_00108ef5:
            stop_decoding(this,JPGD_DECODE_ERROR);
          }
          if (iVar3 < iVar4) {
            iVar2 = iVar4 - iVar3;
            if (0xf < iVar4 - iVar3) {
              iVar2 = 0x10;
            }
            for (lVar9 = 0; iVar2 != (int)lVar9; lVar9 = lVar9 + 1) {
              if (0x40 - (long)iVar3 == lVar9) {
                __assert_fail("kt <= 63",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]usbcam/jpgd.cpp"
                              ,0x729,"void jpgd::jpeg_decoder::decode_next_row()");
              }
              psVar10[*(int *)(g_ZAG + (long)iVar3 * 4 + lVar9 * 4)] = 0;
            }
          }
          if (psVar10[*(int *)(g_ZAG + (long)iVar3 * 4 + 0x3c)] != 0) {
            __assert_fail("p[g_ZAG[k]] == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]usbcam/jpgd.cpp"
                          ,0x72f,"void jpgd::jpeg_decoder::decode_next_row()");
          }
          iVar2 = iVar3 + 0xf;
        }
        else {
          iVar2 = iVar3;
          if (0xf < uVar1) {
            iVar2 = r + iVar3;
            if (0x3f < iVar2) goto LAB_00108ef5;
            if (iVar3 < iVar4) {
              iVar8 = iVar4 - iVar3;
              if (r < iVar4 - iVar3) {
                iVar8 = r;
              }
              for (lVar9 = 0; iVar8 != (int)lVar9; lVar9 = lVar9 + 1) {
                psVar10[*(int *)(g_ZAG + (long)iVar3 * 4 + lVar9 * 4)] = 0;
              }
            }
          }
          iVar3 = extra_bits;
          if (extra_bits < *(int *)(s_extend_test + (ulong)uVar6 * 4)) {
            iVar3 = extra_bits + *(int *)(s_extend_offset + (ulong)uVar6 * 4);
          }
          if (0x3f < iVar2) {
            __assert_fail("k < 64",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]usbcam/jpgd.cpp"
                          ,0x718,"void jpgd::jpeg_decoder::decode_next_row()");
          }
          psVar10[*(int *)(g_ZAG + (long)iVar2 * 4)] = (short)iVar3 * local_40[iVar2];
        }
        iVar3 = iVar2 + 1;
      }
      if (iVar3 < iVar4) {
        lVar9 = (long)iVar3;
        piVar7 = (int *)(g_ZAG + lVar9 * 4);
        for (; lVar9 < iVar4; lVar9 = lVar9 + 1) {
          psVar10[*piVar7] = 0;
          piVar7 = piVar7 + 1;
        }
      }
      this->m_mcu_block_max_zag[local_38] = iVar3;
      psVar10 = psVar10 + 0x40;
      lVar9 = local_38 + 1;
    }
    iVar3 = (int)local_48;
    if (this->m_freq_domain_chroma_upsample == false) {
      transform_mcu(this,iVar3);
    }
    else {
      transform_mcu_expand(this,iVar3);
    }
    this->m_restarts_left = this->m_restarts_left + -1;
    local_48 = (ulong)(iVar3 + 1);
  } while( true );
}

Assistant:

void jpeg_decoder::decode_next_row()
{
  int row_block = 0;

  for (int mcu_row = 0; mcu_row < m_mcus_per_row; mcu_row++)
  {
    if ((m_restart_interval) && (m_restarts_left == 0))
      process_restart();

    jpgd_block_t* p = m_pMCU_coefficients;
    for (int mcu_block = 0; mcu_block < m_blocks_per_mcu; mcu_block++, p += 64)
    {
      int component_id = m_mcu_org[mcu_block];
      jpgd_quant_t* q = m_quant[m_comp_quant[component_id]];

      int r, s;
      s = huff_decode(m_pHuff_tabs[m_comp_dc_tab[component_id]], r);
      s = JPGD_HUFF_EXTEND(r, s);

      m_last_dc_val[component_id] = (s += m_last_dc_val[component_id]);

      p[0] = static_cast<jpgd_block_t>(s * q[0]);

      int prev_num_set = m_mcu_block_max_zag[mcu_block];

      huff_tables *pH = m_pHuff_tabs[m_comp_ac_tab[component_id]];

      int k;
      for (k = 1; k < 64; k++)
      {
        int extra_bits;
        s = huff_decode(pH, extra_bits);

        r = s >> 4;
        s &= 15;

        if (s)
        {
          if (r)
          {
            if ((k + r) > 63)
              stop_decoding(JPGD_DECODE_ERROR);

            if (k < prev_num_set)
            {
              int n = JPGD_MIN(r, prev_num_set - k);
              int kt = k;
              while (n--)
                p[g_ZAG[kt++]] = 0;
            }

            k += r;
          }
          
          s = JPGD_HUFF_EXTEND(extra_bits, s);

          JPGD_ASSERT(k < 64);

          p[g_ZAG[k]] = static_cast<jpgd_block_t>(dequantize_ac(s, q[k])); //s * q[k];
        }
        else
        {
          if (r == 15)
          {
            if ((k + 16) > 64)
              stop_decoding(JPGD_DECODE_ERROR);

            if (k < prev_num_set)
            {
              int n = JPGD_MIN(16, prev_num_set - k);
              int kt = k;
              while (n--)
              {
                JPGD_ASSERT(kt <= 63);
                p[g_ZAG[kt++]] = 0;
              }
            }

            k += 16 - 1; // - 1 because the loop counter is k
            JPGD_ASSERT(p[g_ZAG[k]] == 0);
          }
          else
            break;
        }
      }

      if (k < prev_num_set)
      {
        int kt = k;
        while (kt < prev_num_set)
          p[g_ZAG[kt++]] = 0;
      }

      m_mcu_block_max_zag[mcu_block] = k;

      row_block++;
    }

    if (m_freq_domain_chroma_upsample)
      transform_mcu_expand(mcu_row);
    else
      transform_mcu(mcu_row);

    m_restarts_left--;
  }
}